

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_short>::test_many<(libdivide::Branching)0>
          (DivideTest<unsigned_short> *this,unsigned_short denom)

{
  short sVar1;
  unsigned_short uVar2;
  ushort in_SI;
  DivideTest<unsigned_short> *in_RDI;
  unsigned_short recovered;
  divider<unsigned_short,_(libdivide::Branching)0> the_divider;
  uint16_t twice_rem;
  uint16_t e;
  uint16_t proposed_m;
  uint16_t rem;
  uint8_t more;
  uint8_t floor_log_2_d;
  libdivide_u16_t result;
  uint16_t result_1;
  uint32_t n;
  divider<unsigned_short,_(libdivide::Branching)0> *in_stack_ffffffffffffff40;
  ostream *poVar3;
  undefined8 in_stack_ffffffffffffff48;
  string *psVar4;
  unsigned_short denom_00;
  divider<unsigned_short,_(libdivide::Branching)0> *pdVar5;
  unsigned_short denom_01;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined6 in_stack_ffffffffffffff68;
  unsigned_short in_stack_ffffffffffffff6e;
  DivideTest<unsigned_short> *in_stack_ffffffffffffff70;
  divider<unsigned_short,_(libdivide::Branching)0> local_6d;
  unsigned_short local_6a;
  divider<unsigned_short,_(libdivide::Branching)0> *local_58;
  divider<unsigned_short,_(libdivide::Branching)0> *local_48;
  uint16_t local_40;
  byte local_3e;
  uint16_t local_37;
  byte local_35;
  uint16_t local_34;
  byte local_32;
  ushort local_2e;
  ushort local_2c;
  short local_2a;
  DivideTest<unsigned_short> local_28;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe4;
  uint16_t uVar6;
  byte bVar7;
  uint in_stack_ffffffffffffffec;
  unsigned_short denom_02;
  DivideTest<unsigned_short> *in_stack_fffffffffffffff0;
  uint local_4;
  
  denom_00 = (unsigned_short)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  pdVar5 = &local_6d;
  local_28.rand_n = 0;
  local_28._6_2_ = 0;
  local_58 = pdVar5;
  local_48 = pdVar5;
  if (in_SI == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x307,"libdivide_internal_u16_gen",
            "divider must be != 0");
    abort();
  }
  local_28.seed._3_1_ = 0xf - ((char)LZCOUNT((uint)in_SI) + -0x10);
  if ((in_SI & in_SI - 1) == 0) {
    local_40 = 0;
    local_3e = local_28.seed._3_1_;
  }
  else {
    local_4 = (1 << (local_28.seed._3_1_ & 0x1f)) << 0x10;
    in_stack_fffffffffffffff0 = &local_28;
    local_2a = (short)(local_4 / in_SI);
    sVar1 = local_2a * in_SI;
    local_2c = in_SI + sVar1;
    local_28.seed._2_1_ = local_28.seed._3_1_;
    if (1 << (local_28.seed._3_1_ & 0x1f) <= (int)(uint)local_2c) {
      local_2a = local_2a * 2;
      local_2e = sVar1 * -2;
      if ((in_SI <= local_2e) || (local_2e < (ushort)-sVar1)) {
        local_2a = local_2a + 1;
      }
      local_28.seed._2_1_ = local_28.seed._3_1_ | 0x40;
    }
    local_40 = local_2a + 1;
    local_3e = local_28.seed._2_1_;
    in_stack_ffffffffffffffec = local_4;
  }
  denom_02 = (unsigned_short)(in_stack_ffffffffffffffec >> 0x10);
  local_6a = in_SI;
  local_37 = local_40;
  local_35 = local_3e;
  local_34 = local_40;
  local_32 = local_3e;
  uVar6 = local_40;
  bVar7 = local_3e;
  local_6d.div.denom.magic = local_40;
  local_6d.div.denom.more = local_3e;
  uVar2 = libdivide::divider<unsigned_short,_(libdivide::Branching)0>::recover(&local_6d);
  denom_01 = (unsigned_short)((ulong)pdVar5 >> 0x30);
  if (uVar2 != local_6a) {
    poVar3 = (ostream *)&std::cerr;
    std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
    psVar4 = (string *)&stack0xffffffffffffff70;
    testcase_name_abi_cxx11_
              ((DivideTest<unsigned_short> *)
               CONCAT26(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff64);
    std::operator<<(poVar3,psVar4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::operator<<((ostream *)&std::cerr,": ");
    std::ostream::operator<<((ostream *)&std::cerr,local_6a);
    std::operator<<((ostream *)&std::cerr,", but got ");
    std::ostream::operator<<((ostream *)&std::cerr,uVar2);
    std::operator<<((ostream *)&std::cerr,"\n");
    exit(1);
  }
  test_edgecase_numerators<(libdivide::Branching)0>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6e,
             (divider<unsigned_short,_(libdivide::Branching)0> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  test_small_numerators<(libdivide::Branching)0>(in_RDI,denom_00,in_stack_ffffffffffffff40);
  test_pow2_numerators<(libdivide::Branching)0>
            ((DivideTest<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),denom_01,
             (divider<unsigned_short,_(libdivide::Branching)0> *)in_RDI);
  test_allbits_numerators<(libdivide::Branching)0>(in_RDI,denom_00,in_stack_ffffffffffffff40);
  test_random_numerators<(libdivide::Branching)0>
            ((DivideTest<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),denom_01,
             (divider<unsigned_short,_(libdivide::Branching)0> *)in_RDI);
  test_vectordivide_numerators<(libdivide::Branching)0>
            (in_stack_fffffffffffffff0,denom_02,
             (divider<unsigned_short,_(libdivide::Branching)0> *)
             CONCAT17(bVar7,CONCAT25(uVar6,CONCAT14(in_stack_ffffffffffffffe4,
                                                    CONCAT22(in_SI,in_stack_ffffffffffffffe0)))));
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }